

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbmmap.c
# Opt level: O3

uint mmap_addressof(gbspace_t sect)

{
  uint uVar1;
  
  uVar1 = 0;
  if (sect - rom_n < 0xb) {
    uVar1 = *(uint *)(&DAT_0010d520 + (ulong)(sect - rom_n) * 4);
  }
  return uVar1;
}

Assistant:

unsigned mmap_addressof(gbspace_t sect)
{
    switch (sect)
    {
        case rom_0:    return 0x0000;
        case rom_n:    return 0x4000;
        case vram:     return 0x8000;
        case ram:      return 0xA000;
        case wram_0:   return 0xC000;
        case wram_n:   return 0xD000;
        case echo:     return 0xE000;
        case oam:      return 0xFE00;
        case unusable: return 0xFEA0;
        case io:       return 0xFF00;
        case hram:     return 0xFF80;
        case ie:       return 0xFFFF;
        default:       return 0;
    }
}